

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  bool stdout_is_tty_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"auto");
  if (bVar2) {
    pcVar3 = posix::GetEnv("TERM");
    bVar2 = String::CStringEquals(pcVar3,"xterm");
    local_2a = true;
    if (!bVar2) {
      bVar2 = String::CStringEquals(pcVar3,"xterm-color");
      local_2a = true;
      if (!bVar2) {
        bVar2 = String::CStringEquals(pcVar3,"xterm-256color");
        local_2a = true;
        if (!bVar2) {
          bVar2 = String::CStringEquals(pcVar3,"screen");
          local_2a = true;
          if (!bVar2) {
            bVar2 = String::CStringEquals(pcVar3,"screen-256color");
            local_2a = true;
            if (!bVar2) {
              bVar2 = String::CStringEquals(pcVar3,"tmux");
              local_2a = true;
              if (!bVar2) {
                bVar2 = String::CStringEquals(pcVar3,"tmux-256color");
                local_2a = true;
                if (!bVar2) {
                  bVar2 = String::CStringEquals(pcVar3,"rxvt-unicode");
                  local_2a = true;
                  if (!bVar2) {
                    bVar2 = String::CStringEquals(pcVar3,"rxvt-unicode-256color");
                    local_2a = true;
                    if (!bVar2) {
                      bVar2 = String::CStringEquals(pcVar3,"linux");
                      local_2a = true;
                      if (!bVar2) {
                        local_2a = String::CStringEquals(pcVar3,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_2b = false;
    if (stdout_is_tty) {
      local_2b = local_2a;
    }
    gtest_color._7_1_ = local_2b;
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"yes");
    local_2c = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"true");
      local_2c = true;
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"t");
        local_2c = true;
        if (!bVar2) {
          local_2c = String::CStringEquals(pcVar3,"1");
        }
      }
    }
    gtest_color._7_1_ = local_2c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return gtest_color._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}